

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O1

bool ObjectTempVerify::IsTempTransfer(Instr *instr)

{
  Opnd *this;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  undefined4 *puVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a;
  
  bVar2 = OpCodeAttr::TempObjectTransfer(instr->m_opcode);
  if ((bVar2) || ((instr->m_opcode & ~ExtendedOpcodePrefix) == Ld_I4)) {
    if (((*(ushort *)&instr->field_0x36 & 8) == 0) && (instr->m_dst != (Opnd *)0x0)) {
      OVar3 = IR::Opnd::GetKind(instr->m_dst);
      if (OVar3 == OpndKindReg) {
        this = instr->m_dst;
        OVar3 = IR::Opnd::GetKind(this);
        if (OVar3 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar4 = 0;
        }
        local_1a = (this->m_valueType).field_0;
        bVar2 = ValueType::IsNotObject((ValueType *)&local_1a.field_0);
        if (bVar2) goto LAB_0063ab0c;
      }
    }
    bVar2 = true;
  }
  else {
LAB_0063ab0c:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
ObjectTempVerify::IsTempTransfer(IR::Instr * instr)
{
    if (ObjectTemp::IsTempTransfer(instr)
        // Add the Ld_I4, and LdC_A_I4 as the forward pass might have changed Ld_A to these
        || instr->m_opcode == Js::OpCode::Ld_I4
        || instr->m_opcode == Js::OpCode::LdC_A_I4)
    {
        if (!instr->dstIsTempObject && instr->GetDst() && instr->GetDst()->IsRegOpnd()
          && instr->GetDst()->AsRegOpnd()->GetValueType().IsNotObject())
        {
            // Globopt has proved that dst is not an object, so this is not really an object transfer.
            // This prevents the case where glob opt turned a Conv_Num to Ld_A and expose additional
            // transfer.
            return false;
        }
        return true;
    }
    return false;
}